

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSystemImpl.cpp
# Opt level: O0

bool efsw::Platform::isLocalFUSEDirectory(string *directory)

{
  byte bVar1;
  Platform local_88 [8];
  string devicePath;
  string local_58 [32];
  Platform local_38 [32];
  string *local_18;
  string *directory_local;
  
  local_18 = directory;
  efsw::FileSystem::dirRemoveSlashAtEnd(directory);
  std::__cxx11::string::string(local_58,(string *)directory);
  findMountPoint(local_38,(string *)local_58);
  std::__cxx11::string::operator=((string *)directory,(string *)local_38);
  std::__cxx11::string::~string((string *)local_38);
  std::__cxx11::string::~string(local_58);
  bVar1 = std::__cxx11::string::empty();
  if ((bVar1 & 1) == 0) {
    findDevicePath(local_88,directory);
    bVar1 = std::__cxx11::string::empty();
    directory_local._7_1_ = (bVar1 ^ 0xff) & 1;
    std::__cxx11::string::~string((string *)local_88);
  }
  else {
    directory_local._7_1_ = 0;
  }
  return (bool)(directory_local._7_1_ & 1);
}

Assistant:

bool isLocalFUSEDirectory( std::string directory ) {
	efsw::FileSystem::dirRemoveSlashAtEnd( directory );

	directory = findMountPoint( directory );

	if ( !directory.empty() ) {
		std::string devicePath = findDevicePath( directory );

		return !devicePath.empty();
	}

	return false;
}